

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

string * EncodeBase64_abi_cxx11_(Span<const_unsigned_char> input)

{
  uchar *puVar1;
  uchar *puVar2;
  size_type sVar3;
  string *in_RDI;
  long in_FS_OFFSET;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string *this_00;
  size_type in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  local_8 = *(size_type *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffa0);
  Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_ffffffffffffff88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (this_00,in_stack_ffffffffffffffb8);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffe8;
  puVar1 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)in_stack_ffffffffffffff88);
  puVar2 = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)in_stack_ffffffffffffff88);
  ConvertBits<8,6,true,EncodeBase64[abi:cxx11](Span<unsigned_char_const>)::__0,unsigned_char_const*,(anonymous_namespace)::IntIdentity>
            (this_00,puVar1,puVar2);
  while (sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size(in_stack_ffffffffffffff88), (sVar3 & 3) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,in_stack_ffffffffffffff97);
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string EncodeBase64(Span<const unsigned char> input)
{
    static const char *pbase64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    std::string str;
    str.reserve(((input.size() + 2) / 3) * 4);
    ConvertBits<8, 6, true>([&](int v) { str += pbase64[v]; }, input.begin(), input.end());
    while (str.size() % 4) str += '=';
    return str;
}